

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,int variable,TPZVec<double> *value)

{
  long lVar1;
  long lVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  ostream *poVar5;
  long lVar6;
  undefined4 in_register_00000034;
  char *pcVar7;
  int64_t newsize;
  bool bVar8;
  double local_78;
  TPZVec<TPZMaterialDataT<double>_> datavec;
  TPZVec<int> nshape;
  
  lVar2 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))
                    (this,CONCAT44(in_register_00000034,variable));
  if (lVar2 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar5 = std::operator<<(poVar5,
                             "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate(int, TPZVec<STATE> &) [TGeometry = pzgeom::TPZGeoTetrahedra]"
                            );
    pcVar7 = " : no material for this element\n";
  }
  else {
    pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
    if (pTVar3 != (TPZGeoEl *)0x0) {
      newsize = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
      datavec._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016496a8;
      datavec.fStore = (TPZMaterialDataT<double> *)0x0;
      datavec.fNElements = 0;
      datavec.fNAlloc = 0;
      TPZVec<TPZMaterialDataT<double>_>::Resize(&datavec,newsize);
      TPZVec<int>::TPZVec(&nshape,newsize);
      lVar2 = 0;
      if (newsize < 1) {
        newsize = lVar2;
      }
      lVar6 = 0;
      while (bVar8 = newsize != 0, newsize = newsize + -1, bVar8) {
        lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                         lVar2);
        if (lVar1 != 0) {
          plVar4 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                          &TPZInterpolationSpace::typeinfo,0);
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 0x298))
                      (plVar4,(long)((datavec.fStore)->super_TPZMaterialData).super_TPZShapeData.
                                    fCornerNodeIds.fExtAlloc + lVar6 + -0x30);
          }
        }
        lVar6 = lVar6 + 0x8230;
        lVar2 = lVar2 + 0x10;
      }
      local_78 = 0.0;
      TPZVec<double>::Fill(value,&local_78,0,-1);
      TPZVec<int>::~TPZVec(&nshape);
      TPZVec<TPZMaterialDataT<double>_>::~TPZVec(&datavec);
      return;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar5 = std::operator<<(poVar5,
                             "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate(int, TPZVec<STATE> &) [TGeometry = pzgeom::TPZGeoTetrahedra]"
                            );
    pcVar7 = " : no reference element\n";
  }
  std::operator<<(poVar5,pcVar7);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::Integrate(int variable, TPZVec<STATE> & value){
    TPZMaterial * material = this->Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " : no material for this element\n";
        return;
    }
    if (!this->Reference()){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " : no reference element\n";
        return;
    }
    
    int64_t nref = fElementVec.size();
    TPZVec<TPZMaterialDataT<STATE>> datavec;
    datavec.resize(nref);
    
#ifdef PZDEBUG
    if (nref != datavec.size()) {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " The number of materials can not be different from the size of the fElementVec !\n";
        DebugStop();
    }
#endif
    
    TPZVec<int> nshape(nref);
    for (int64_t iref = 0; iref<nref; iref++)
    {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if(!msp) continue;
        msp->InitMaterialData(datavec[iref]);
    }
    
    
    //	TPZManVector<REAL, 3> intpoint(dim,0.);
    //	const int varsize = material->NSolutionVariables(variable);
    //	value.Resize(varsize);
    value.Fill(0.);
    //
    //	const TPZIntPoints &intrule = this->GetIntegrationRule();
    //	int npoints = intrule.NPoints(), ip, iv;
    //	TPZManVector<REAL> sol(varsize);
    //	for(ip=0;ip<npoints;ip++){
    //		intrule.Point(ip,intpoint,weight);
    //		sol.Fill(0.);
    //		this->Solution(intpoint, variable, sol);
    //		//Tiago: Next call is performed only for computing detcaj. The previous method (Solution) has already computed jacobian.
    //		//       It means that the next call would not be necessary if I wrote the whole code here.
    //		this->Reference()->Jacobian(intpoint, data.jacobian, data.axes, data.detjac, data.jacinv);
    //		weight *= fabs(data.detjac);
    //		for(iv = 0; iv < varsize; iv++) {
    //#if !BUILD_COMPLEX_PROJECTS
    //			DebugStop();
    //#else
    //			value[iv] += sol[iv]*weight;
    //#endif
    //		}//for iv
    //	}//for ip
}